

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O1

void __thiscall kj::Vector<void_*>::setCapacity(Vector<void_*> *this,size_t newSize)

{
  void **ppvVar1;
  void **ppvVar2;
  RemoveConst<void_*> *ppvVar3;
  void **__dest;
  ulong __n;
  ArrayBuilder<void_*> newBuilder;
  ArrayBuilder<void_*> local_38;
  
  ppvVar1 = (this->builder).ptr;
  if (newSize < (ulong)((long)(this->builder).pos - (long)ppvVar1 >> 3)) {
    (this->builder).pos = ppvVar1 + newSize;
  }
  __dest = (void **)kj::_::HeapArrayDisposer::allocateImpl
                              (8,0,newSize,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  local_38.endPtr = __dest + newSize;
  local_38.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  ppvVar1 = (this->builder).ptr;
  ppvVar2 = (this->builder).pos;
  local_38.ptr = __dest;
  if (ppvVar1 != ppvVar2) {
    __n = (long)ppvVar2 - (long)ppvVar1 & 0xfffffffffffffff8;
    local_38.pos = __dest;
    memcpy(__dest,ppvVar1,__n);
    __dest = (void **)((long)__dest + __n);
  }
  local_38.pos = __dest;
  ArrayBuilder<void_*>::operator=(&this->builder,&local_38);
  ppvVar2 = local_38.endPtr;
  ppvVar3 = local_38.pos;
  ppvVar1 = local_38.ptr;
  if (local_38.ptr != (void **)0x0) {
    local_38.ptr = (void **)0x0;
    local_38.pos = (RemoveConst<void_*> *)0x0;
    local_38.endPtr = (void **)0x0;
    (**(local_38.disposer)->_vptr_ArrayDisposer)
              (local_38.disposer,ppvVar1,8,(long)ppvVar3 - (long)ppvVar1 >> 3,
               (long)ppvVar2 - (long)ppvVar1 >> 3,0);
  }
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }